

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.cpp
# Opt level: O1

optional<(anonymous_namespace)::ParseFunctionResult> *
anon_unknown.dwarf_122d34::parseFunction
          (optional<(anonymous_namespace)::ParseFunctionResult> *__return_storage_ptr__,
          const_iterator *iBegin,const_iterator *iEnd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *functionNames,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argNames,size_t argCount)

{
  _Base_ptr p_Var1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  const_iterator cVar9;
  const_reference pvVar10;
  const_iterator cVar11;
  ulong uVar12;
  size_t *psVar13;
  Exception *pEVar14;
  char *unaff_R13;
  optional<(anonymous_namespace)::ParseFunctionResult> *poVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer s;
  bool bVar16;
  optional<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oVar17;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  string currentArgName;
  optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  r;
  const_iterator local_160;
  undefined1 local_158 [32];
  key_type local_138;
  optional<(anonymous_namespace)::ParseFunctionResult> *local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  _Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  void *pvStack_f0;
  char *local_e8;
  long lStack_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_d8;
  char *local_a8;
  _Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_a0;
  char *local_98;
  void *local_90;
  iterator iStack_88;
  pointer local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_78;
  char local_48;
  _Base_ptr local_40;
  size_t local_38;
  
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_f8 = 0;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_108 = (_Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               )0x0;
  uStack_100 = 0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_a8 = (char *)0x0;
  _Stack_a0 = (_Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               )0x0;
  local_98 = (char *)0x0;
  local_90 = (void *)0x0;
  iStack_88._M_current = (pointer)0x0;
  local_80 = (pointer)0x0;
  pvStack_f0 = (void *)0x0;
  local_e8 = (char *)0x0;
  lStack_e0 = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = '\x01';
  local_118 = __return_storage_ptr__;
  local_110 = &argNames->_M_t;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = argCount;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree(&local_d8);
  if (pvStack_f0 != (void *)0x0) {
    operator_delete(pvStack_f0,lStack_e0 - (long)pvStack_f0);
  }
  s = (functionNames->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (functionNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (s == pbVar2) {
    bVar3 = false;
  }
  else {
    do {
      oVar17 = (anonymous_namespace)::
               isStartsWith<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         (iBegin,iEnd,s);
      local_108 = oVar17.
                  super__Optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_payload;
      uStack_100 = CONCAT71(uStack_100._1_7_,
                            oVar17.
                            super__Optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_engaged);
      if (((((undefined1  [16])
             oVar17.
             super__Optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
          (cVar9 = parseComment(&local_108._M_value,iEnd), cVar9._M_current == iEnd->_M_current)) ||
         (*cVar9._M_current != '(')) {
        bVar3 = false;
      }
      else {
        unaff_R13 = cVar9._M_current + 1;
        local_a8 = iBegin->_M_current;
        _Stack_a0 = local_108;
        bVar3 = true;
      }
    } while ((!bVar3) && (s = s + 1, s != pbVar2));
  }
  if (!bVar3) {
    (local_118->super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
    _M_payload.
    super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>.
    super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>._M_engaged = false;
    poVar15 = local_118;
LAB_0013408a:
    if (local_48 == '\x01') {
      local_48 = 0;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~_Rb_tree(&local_78);
      if (local_90 != (void *)0x0) {
        operator_delete(local_90,(long)local_80 - (long)local_90);
      }
    }
    return poVar15;
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_40 = &(((_Rep_type *)&local_110->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  bVar6 = true;
  bVar5 = true;
  bVar4 = false;
  bVar3 = true;
  local_160._M_current = unaff_R13;
LAB_00133ce5:
  do {
    local_160 = parseComment(&local_160,iEnd);
    poVar15 = local_118;
    if (local_160._M_current == iEnd->_M_current) {
LAB_001340d6:
      pEVar14 = (Exception *)__cxa_allocate_exception(0x60);
      local_108 = (_Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                   )&local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
      rlib::sequencer::MmlCompiler::Exception::Exception
                (pEVar14,functionCallError,&local_160,iEnd,(string *)&local_108._M_value);
      __cxa_throw(pEVar14,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                  rlib::sequencer::MmlCompiler::Exception::~Exception);
    }
    if ((bVar3) && (*local_160._M_current == ')')) {
      local_98 = local_160._M_current + 1;
      (local_118->super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
      _M_payload.
      super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>.
      super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>._M_engaged = false;
      if (local_48 == '\x01') {
        (local_118->super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
        _M_payload.
        super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>.
        super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>._M_payload._M_value
        .next._M_current = local_98;
        (local_118->super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
        _M_payload.
        super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>.
        super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>._M_payload._M_value
        .functionName.first =
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_a8;
        *(_Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          *)&(local_118->
             super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
             _M_payload.
             super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
             .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>._M_payload.
             _M_value.functionName.second = _Stack_a0;
        *(void **)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload._M_value.argsList.
                   super__Vector_base<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl = local_90;
        *(variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          **)((long)&(local_118->
                     super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>)
                     ._M_payload.
                     super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                     _M_payload._M_value.argsList.
                     super__Vector_base<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             + 8) = iStack_88._M_current;
        *(pointer *)
         ((long)&(local_118->
                 super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                 _M_payload.
                 super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                 .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                 _M_payload._M_value.argsList.
                 super__Vector_base<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         + 0x10) = local_80;
        local_90 = (void *)0x0;
        iStack_88._M_current = (pointer)0x0;
        local_80 = (pointer)0x0;
        p_Var1 = (_Base_ptr)
                 ((long)&(local_118->
                         super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>
                         )._M_payload.
                         super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                         .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                         _M_payload + 0x38);
        if (local_78._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          *(undefined4 *)
           ((long)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload + 0x38) = 0;
          *(undefined8 *)
           ((long)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload + 0x40) = 0;
          *(_Base_ptr *)
           ((long)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload + 0x48) = p_Var1;
          *(_Base_ptr *)
           ((long)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload + 0x50) = p_Var1;
          psVar13 = (size_t *)
                    ((long)&(local_118->
                            super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>
                            )._M_payload.
                            super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                            .
                            super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>
                            ._M_payload + 0x58);
        }
        else {
          psVar13 = &local_78._M_impl.super__Rb_tree_header._M_node_count;
          *(_Rb_tree_color *)
           ((long)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload + 0x38) = local_78._M_impl.super__Rb_tree_header._M_header._M_color;
          *(_Base_ptr *)
           ((long)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload + 0x40) = local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
          *(_Base_ptr *)
           ((long)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload + 0x48) = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
          *(_Base_ptr *)
           ((long)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload + 0x50) = local_78._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_78._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var1;
          *(size_t *)
           ((long)&(local_118->
                   super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>
                   .super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>.
                   _M_payload + 0x58) = local_78._M_impl.super__Rb_tree_header._M_node_count;
          local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_78._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_78._M_impl.super__Rb_tree_header._M_header;
          local_78._M_impl.super__Rb_tree_header._M_header._M_right =
               local_78._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        *psVar13 = 0;
        (local_118->super__Optional_base<(anonymous_namespace)::ParseFunctionResult,_false,_false>).
        _M_payload.
        super__Optional_payload<(anonymous_namespace)::ParseFunctionResult,_true,_false,_false>.
        super__Optional_payload_base<(anonymous_namespace)::ParseFunctionResult>._M_engaged = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                 local_138.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0013408a;
    }
    if ((bVar4) && (*local_160._M_current == ',')) {
      local_160._M_current = local_160._M_current + 1;
      bVar6 = true;
      bVar5 = true;
      bVar4 = false;
      bVar3 = true;
      goto LAB_00133ce5;
    }
    if (bVar5) {
      if (((anonymous_namespace)::
           parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
           ::re == '\0') &&
         (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::
                                       parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
                                       ::re), iVar8 != 0)) {
        boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
        basic_regex(&parseFunction::re,"^([a-zA-Z]\\w*)",0);
        __cxa_atexit(boost::
                     basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                     ~basic_regex,&parseFunction::re,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
                             ::re);
      }
      regexSearch((optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&local_108._M_value,&local_160,iEnd,&parseFunction::re);
      bVar16 = true;
      if ((char)local_d8._M_impl.super__Rb_tree_header._M_header._M_right == '\x01') {
        pvVar10 = boost::
                  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&local_108._M_value,0);
        cVar9 = parseComment(&(pvVar10->
                              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ).second,iEnd);
        bVar16 = *cVar9._M_current != ':';
        if (!bVar16) {
          pvVar10 = boost::
                    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)&local_108._M_value,0);
          boost::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                pvVar10);
          std::__cxx11::string::operator=((string *)&local_138,(string *)local_158);
          if ((mapped_type *)local_158._0_8_ != (mapped_type *)(local_158 + 0x10)) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          cVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(local_110,&local_138);
          if (cVar11._M_node == local_40) {
            pEVar14 = (Exception *)__cxa_allocate_exception(0x60);
            local_158._0_8_ = local_158 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
            rlib::sequencer::MmlCompiler::Exception::Exception
                      (pEVar14,argumentUnknownError,&local_160,iEnd,(string *)local_158);
            __cxa_throw(pEVar14,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                        rlib::sequencer::MmlCompiler::Exception::~Exception);
          }
          local_160._M_current = cVar9._M_current + 1;
          bVar6 = true;
          bVar5 = false;
          bVar4 = false;
          bVar3 = false;
        }
      }
      if ((char)local_d8._M_impl.super__Rb_tree_header._M_header._M_right == '\x01') {
        local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)
             ((ulong)local_d8._M_impl.super__Rb_tree_header._M_header._M_right & 0xffffffffffffff00)
        ;
        boost::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&local_108._M_value);
      }
      if (!bVar16) goto LAB_00133ce5;
    }
    if (!bVar6) goto LAB_001340d6;
    rlib::sequencer::MmlCompiler::Util::parseWord
              ((optional<rlib::sequencer::MmlCompiler::Util::ParsedWord> *)&local_108._M_value,
               &local_160,iEnd);
    cVar7 = (char)lStack_e0;
    if ((char)lStack_e0 == '\x01') {
      if ((char)pvStack_f0 == '\0') {
        pEVar14 = (Exception *)__cxa_allocate_exception(0x60);
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
        rlib::sequencer::MmlCompiler::Exception::Exception
                  (pEVar14,argumentError,&local_160,iEnd,(string *)local_158);
        __cxa_throw(pEVar14,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                    rlib::sequencer::MmlCompiler::Exception::~Exception);
      }
      local_160._M_current = local_e8;
      if (local_138._M_string_length == 0) {
        if (iStack_88._M_current == local_80) {
          std::
          vector<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,std::allocator<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
          ::
          _M_realloc_insert<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>
                    ((vector<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,std::allocator<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
                      *)&local_90,iStack_88,
                     (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_108._M_value);
        }
        else {
          *(undefined8 *)
           &((iStack_88._M_current)->
            super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ).
            super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            ._M_index = local_f8;
          *(undefined4 *)
           &((iStack_88._M_current)->
            super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ).
            super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            .
            super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
            ._M_u = local_108._0_4_;
          *(undefined4 *)
           ((long)&((iStack_88._M_current)->
                   super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).
                   super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   ._M_u + 4) = local_108._4_4_;
          *(undefined4 *)
           ((long)&((iStack_88._M_current)->
                   super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).
                   super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   ._M_u + 8) = (undefined4)uStack_100;
          *(undefined4 *)
           ((long)&((iStack_88._M_current)->
                   super__Variant_base<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).
                   super__Move_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_assign_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Move_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_ctor_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Variant_storage_alias<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char>_>_>_>
                   ._M_u + 0xc) = uStack_100._4_4_;
          iStack_88._M_current = iStack_88._M_current + 1;
        }
        uVar12 = ((long)iStack_88._M_current - (long)local_90 >> 3) * -0x5555555555555555;
        bVar6 = false;
        bVar5 = false;
        bVar4 = true;
        bVar3 = true;
        if (local_38 <= uVar12 && uVar12 - local_38 != 0) {
          pEVar14 = (Exception *)__cxa_allocate_exception(0x60);
          local_158._0_8_ = local_158 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
          rlib::sequencer::MmlCompiler::Exception::Exception
                    (pEVar14,argumentError,&local_160,iEnd,(string *)local_158);
          __cxa_throw(pEVar14,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                      rlib::sequencer::MmlCompiler::Exception::~Exception);
        }
      }
      else {
        local_158._0_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                           *)&local_78,&local_138);
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&>
          ::_S_vtable._M_arr[(long)(char)local_f8 + 1]._M_data)
                  ((anon_class_8_1_8991fb9c *)local_158,
                   (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_108);
        local_138._M_string_length = 0;
        *local_138._M_dataplus._M_p = '\0';
        bVar6 = false;
        bVar5 = false;
        bVar4 = true;
        bVar3 = true;
      }
    }
    if (cVar7 == '\0') {
      pEVar14 = (Exception *)__cxa_allocate_exception(0x60);
      local_108 = (_Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                   )&local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
      rlib::sequencer::MmlCompiler::Exception::Exception
                (pEVar14,argumentError,&local_160,iEnd,(string *)&local_108._M_value);
      __cxa_throw(pEVar14,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                  rlib::sequencer::MmlCompiler::Exception::~Exception);
    }
  } while( true );
}

Assistant:

auto parseFunction(
	const std::string::const_iterator& iBegin,
	const std::string::const_iterator& iEnd,
	const std::vector<std::string>& functionNames,				// 関数名
	const std::set<std::string>& argNames,						// 名前付き引数名(ココにない引数名はエラー)
	const size_t argCount = (std::numeric_limits<size_t>::max)()	// 名前ナシ引数数(ココを超える数の引数はエラー)
) {
	std::optional<ParseFunctionResult> result = ParseFunctionResult();

	const auto func = [&]()->std::optional<std::string::const_iterator> {
		struct R {
			PairIterator				functionName;	// 関数名
			std::string::const_iterator	next;			// 次の位置
		};
		for (auto& name : functionNames) {
			const auto r = isStartsWith(iBegin, iEnd, name);
			if (!r) continue;
			auto it = parseComment(*r, iEnd);		// コメントを読み飛ばす
			if (it == iEnd || *it != '(') continue;
			it++;
			result->functionName = { iBegin,*r };
			return it;
		}
		return std::nullopt;
	}();
	if (!func) return decltype(result)();		// 該当しなかった

	std::string currentArgName;
	union {									// 次トークン情報
		struct {
			uint16_t	rightParen : 1;		// )
			uint16_t	comma : 1;			// ,
			uint16_t	argName : 1;		// 引数名
			uint16_t	argValue : 1;		// 引数値
		};
		uint16_t		all = 0;
	}flags;
	flags.rightParen = true;
	flags.argName = true;
	flags.argValue = true;

	auto it = *func;
	while (true) {
		it = parseComment(it, iEnd);		// コメントを読み飛ばす
		if (it == iEnd) break;

		if (flags.rightParen && *it == ')') {		// )
			result->next = it + 1;						// 次の位置
			return result;								// 正常終了
		}

		if (flags.comma && *it == ',') {			// ,
			it++;
			flags.all = 0;
			flags.rightParen = true;
			flags.argName = true;
			flags.argValue = true;
			continue;
		}

		if (flags.argName) {		// 引数名
			static const auto re = regex(R"(^([a-zA-Z]\w*))");
			if (const auto r = regexSearch(it, iEnd, re)) {
				const auto next = parseComment((*r)[0].second, iEnd);			// コメントを読み飛ばす
				if (*next == ':') {													// ":" があれば引数名で確定
					currentArgName = (*r)[0].str();
					if (auto i = argNames.find(currentArgName); i == argNames.end()) {	// 引数名チェック
						throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentUnknownError, it, iEnd);
					}
					it = next + 1;
					flags.all = 0;
					flags.argValue = true;
					continue;
				}
			}
		}

		if (flags.argValue) {		// 引数値

			if (auto r = MmlCompiler::Util::parseWord(it, iEnd)) {
				if (!r->word) {			// パースエラー
					throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentError, it, iEnd);	// 文字列パースエラーとする
				}
				it = r->next;
				if (currentArgName.empty()) {
					result->argsList.emplace_back(std::move(*r->word));
					if (result->argsList.size() > argCount) {
						throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentError, it, iEnd);	// 引数が多すぎる
					}
				} else {
					result->argsName[currentArgName] = std::move(*r->word);
					currentArgName.clear();
				}
				flags.all = 0;
				flags.rightParen = true;
				flags.comma = true;
				continue;
			}

			throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentError, it, iEnd);
		}

		break;		// どれにも該当しないならエラー
	}
	throw MmlCompiler::Exception(MmlCompiler::Exception::Code::functionCallError, it, iEnd);
}